

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlParseReference(htmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  uint uVar2;
  htmlEntityDesc *phVar3;
  charactersSAXFunc p_Var4;
  int iVar5;
  char *pcVar6;
  void *pvVar7;
  long lVar8;
  xmlChar out [6];
  xmlChar *name;
  
  pxVar1 = ctxt->input->cur;
  if (*pxVar1 != '&') {
    return;
  }
  if (pxVar1[1] == '#') {
    uVar2 = htmlParseCharRef(ctxt);
    if (uVar2 == 0) {
      return;
    }
    if (uVar2 < 0x80) {
      out[0] = (xmlChar)uVar2;
      iVar5 = -6;
    }
    else if (uVar2 < 0x800) {
      out[0] = (byte)(uVar2 >> 6) | 0xc0;
      iVar5 = 0;
    }
    else if (uVar2 < 0x10000) {
      out[0] = (byte)(uVar2 >> 0xc) | 0xe0;
      iVar5 = 6;
    }
    else {
      out[0] = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
      iVar5 = 0xc;
    }
    lVar8 = 1;
    for (; -1 < iVar5; iVar5 = iVar5 + -6) {
      out[lVar8] = (byte)(uVar2 >> ((byte)iVar5 & 0x1f)) & 0x3f | 0x80;
      lVar8 = lVar8 + 1;
    }
  }
  else {
    phVar3 = htmlParseEntityRef(ctxt,&name);
    if (name == (xmlChar *)0x0) {
      htmlCheckParagraph(ctxt);
      if (ctxt->sax == (_xmlSAXHandler *)0x0) {
        return;
      }
      p_Var4 = ctxt->sax->characters;
      if (p_Var4 == (charactersSAXFunc)0x0) {
        return;
      }
      pvVar7 = ctxt->userData;
      pcVar6 = "&";
      iVar5 = 1;
      goto LAB_0014fd49;
    }
    if ((phVar3 == (htmlEntityDesc *)0x0) || (uVar2 = phVar3->value, uVar2 == 0)) {
      htmlCheckParagraph(ctxt);
      if (ctxt->sax == (_xmlSAXHandler *)0x0) {
        return;
      }
      p_Var4 = ctxt->sax->characters;
      if (p_Var4 == (charactersSAXFunc)0x0) {
        return;
      }
      (*p_Var4)(ctxt->userData,(xmlChar *)"&",1);
      pvVar7 = ctxt->userData;
      p_Var4 = ctxt->sax->characters;
      iVar5 = xmlStrlen(name);
      (*p_Var4)(pvVar7,name,iVar5);
      return;
    }
    if (uVar2 < 0x80) {
      out[0] = (xmlChar)uVar2;
      iVar5 = -6;
    }
    else if (uVar2 < 0x800) {
      out[0] = (byte)(uVar2 >> 6) | 0xc0;
      iVar5 = 0;
    }
    else if (uVar2 < 0x10000) {
      out[0] = (byte)(uVar2 >> 0xc) | 0xe0;
      iVar5 = 6;
    }
    else {
      out[0] = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
      iVar5 = 0xc;
    }
    lVar8 = 1;
    for (; -1 < iVar5; iVar5 = iVar5 + -6) {
      out[lVar8] = (byte)(uVar2 >> ((byte)iVar5 & 0x1f)) & 0x3f | 0x80;
      lVar8 = lVar8 + 1;
    }
  }
  out[lVar8] = '\0';
  htmlCheckParagraph(ctxt);
  if (ctxt->sax == (_xmlSAXHandler *)0x0) {
    return;
  }
  p_Var4 = ctxt->sax->characters;
  if (p_Var4 == (charactersSAXFunc)0x0) {
    return;
  }
  pvVar7 = ctxt->userData;
  pcVar6 = (char *)out;
  iVar5 = (int)lVar8;
LAB_0014fd49:
  (*p_Var4)(pvVar7,(xmlChar *)pcVar6,iVar5);
  return;
}

Assistant:

static void
htmlParseReference(htmlParserCtxtPtr ctxt) {
    const htmlEntityDesc * ent;
    xmlChar out[6];
    const xmlChar *name;
    if (CUR != '&') return;

    if (NXT(1) == '#') {
	unsigned int c;
	int bits, i = 0;

	c = htmlParseCharRef(ctxt);
	if (c == 0)
	    return;

        if      (c <    0x80) { out[i++]= c;                bits= -6; }
        else if (c <   0x800) { out[i++]=((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) { out[i++]=((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  { out[i++]=((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            out[i++]= ((c >> bits) & 0x3F) | 0x80;
        }
	out[i] = 0;

	htmlCheckParagraph(ctxt);
	if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL))
	    ctxt->sax->characters(ctxt->userData, out, i);
    } else {
	ent = htmlParseEntityRef(ctxt, &name);
	if (name == NULL) {
	    htmlCheckParagraph(ctxt);
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL))
	        ctxt->sax->characters(ctxt->userData, BAD_CAST "&", 1);
	    return;
	}
	if ((ent == NULL) || !(ent->value > 0)) {
	    htmlCheckParagraph(ctxt);
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL)) {
		ctxt->sax->characters(ctxt->userData, BAD_CAST "&", 1);
		ctxt->sax->characters(ctxt->userData, name, xmlStrlen(name));
		/* ctxt->sax->characters(ctxt->userData, BAD_CAST ";", 1); */
	    }
	} else {
	    unsigned int c;
	    int bits, i = 0;

	    c = ent->value;
	    if      (c <    0x80)
	            { out[i++]= c;                bits= -6; }
	    else if (c <   0x800)
	            { out[i++]=((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
	    else if (c < 0x10000)
	            { out[i++]=((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
	    else
	            { out[i++]=((c >> 18) & 0x07) | 0xF0;  bits= 12; }

	    for ( ; bits >= 0; bits-= 6) {
		out[i++]= ((c >> bits) & 0x3F) | 0x80;
	    }
	    out[i] = 0;

	    htmlCheckParagraph(ctxt);
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL))
		ctxt->sax->characters(ctxt->userData, out, i);
	}
    }
}